

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_WcsicmpNegativeLT_Test::Body
          (iu_UnitStringTest_x_iutest_x_WcsicmpNegativeLT_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *in_R9;
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  int *in_stack_fffffffffffffd78;
  bool local_279;
  AssertionResult local_278;
  AssertionHelper local_250;
  ExpressionResult local_220;
  wchar_t local_1f8 [6];
  ExpressionLHS<unsigned_long> local_1e0;
  unsigned_long local_1b8 [2];
  undefined1 local_1a8 [32];
  bool local_188;
  ios_base local_128 [264];
  
  local_1f8[0] = L'a';
  local_1f8[1] = L'a';
  local_1f8[2] = L'a';
  local_1f8[3] = L'\xffffffff';
  local_1f8[4] = 0;
  local_1b8[1] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::ExpressionLHS(&local_1e0,local_1b8 + 1);
  local_1b8[0] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::operator>=(&local_220,&local_1e0,local_1b8);
  local_279 = true;
  iutest::detail::ExpressionResult::operator&&((ExpressionResult *)&local_250,&local_220,&local_279)
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1a8,(ExpressionResult *)&local_250,true);
  paVar1 = &local_278.m_message.field_2;
  local_278.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
             local_1a8._8_8_ + CONCAT44(local_1a8._4_4_,local_1a8._0_4_));
  local_278.m_result = local_188;
  if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1);
  }
  paVar2 = &local_250.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                  (int)local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
      paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                             _4_4_,(int)local_250.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p),
                    local_250.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  paVar3 = &local_220.m_result.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_result.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.m_result.m_message._M_dataplus._M_p,
                    local_220.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != &local_1e0.m_message.field_2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_278.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_220,(internal *)&local_278,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,local_220.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e0);
    local_250.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_250.m_part_result.super_iuCodeMessage.m_line = 0x41;
    local_250.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_250,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        paVar2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_250.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_250.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_result.m_message._M_dataplus._M_p != paVar3) {
LAB_00152b42:
      operator_delete(local_220.m_result.m_message._M_dataplus._M_p,
                      local_220.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_message._M_dataplus._M_p,
                      CONCAT71(local_278.m_message.field_2._M_allocated_capacity._1_7_,
                               local_278.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_1a8._0_4_ = 0;
    local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
         wcscasecmp(L"AAA",local_1f8);
    if (0 < (int)local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) {
      local_278.m_message._M_string_length = 0;
      local_278.m_message.field_2._M_local_buf[0] = '\0';
      local_278.m_result = true;
      local_278.m_message._M_dataplus._M_p = (pointer)paVar1;
      goto LAB_00152b6b;
    }
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_278,(internal *)0x16fae4,
               "::iutest::detail::iu_wcsicmp(L\"AAA\", negative_sample)","<",local_1a8,
               (int *)&local_250,in_stack_fffffffffffffd78);
    if ((local_278.m_result & 1U) != 0) goto LAB_00152b6b;
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,local_278.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_220);
    local_250.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_250.m_part_result.super_iuCodeMessage.m_line = 0x42;
    local_250.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_250,(Fixed *)local_1a8,false);
    local_220.m_result.m_message._M_dataplus._M_p =
         (pointer)CONCAT44(local_250.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                           _4_4_,(int)local_250.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p);
    local_220.m_result.m_message.field_2._M_allocated_capacity =
         local_250.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_result.m_message._M_dataplus._M_p != paVar2) goto LAB_00152b42;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
LAB_00152b6b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_message._M_dataplus._M_p,
                    CONCAT71(local_278.m_message.field_2._M_allocated_capacity._1_7_,
                             local_278.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, WcsicmpNegativeLT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAA", negative_sample));
}